

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffc2uxx(char *cval,char *dtype,ULONGLONG *ival,int *lval,char *sval,double *dval,int *status)

{
  char cVar1;
  
  ffdtyp(cval,dtype,status);
  cVar1 = *dtype;
  if (cVar1 == 'F') {
    ffc2dd(cval,dval,status);
  }
  else if (cVar1 == 'L') {
    if (*status < 1) {
      *lval = (uint)(*cval == 'T');
    }
  }
  else if (cVar1 == 'I') {
    ffc2ujj(cval,ival,status);
  }
  else {
    ffc2s(cval,sval,status);
  }
  return *status;
}

Assistant:

int ffc2uxx(const char *cval,   /* I - formatted string representation of the value */
          char *dtype,         /* O - datatype code: C, L, F, I or X  */

    /* Only one of the following will be defined, depending on datatype */
          ULONGLONG *ival, /* O - integer value       */
          int *lval,     /* O - logical value       */
          char *sval,    /* O - string value        */
          double *dval,  /* O - double value        */

          int *status)   /* IO - error status */
/*
  high level routine to convert formatted character string to its
  intrinsic data type
*/
{
    ffdtyp(cval, dtype, status);     /* determine the datatype */

    if (*dtype == 'I')
        ffc2ujj(cval, ival, status);
    else if (*dtype == 'F')
        ffc2dd(cval, dval, status);
    else if (*dtype == 'L')
        ffc2ll(cval, lval, status);
    else 
        ffc2s(cval, sval, status);   /* C and X formats */
        
    return(*status);
}